

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void vera::setWindowSize(int _width,int _height)

{
  GLFWwindow *handle;
  float fVar1;
  float fVar2;
  undefined4 local_28;
  undefined4 local_24;
  
  handle = window;
  if (properties.style != EMBEDDED) {
    fVar1 = getPixelDensity(true);
    fVar2 = getPixelDensity(true);
    glfwSetWindowSize(handle,(int)((float)_width / fVar1),(int)((float)_height / fVar2));
  }
  local_24 = (float)_height;
  local_28 = (float)_width;
  fVar1 = getPixelDensity(true);
  fVar2 = getPixelDensity(true);
  setViewport(local_28 / fVar1,local_24 / fVar2);
  return;
}

Assistant:

void setWindowSize(int _width, int _height) {
#if defined(__EMSCRIPTEN__)
    setViewport((float)_width, (float)_height);
    glfwSetWindowSize(window, _width * getPixelDensity(true), _height * getPixelDensity(true));
    return;

#elif defined(DRIVER_GLFW)
    if (properties.style != EMBEDDED)
        glfwSetWindowSize(window, _width / getPixelDensity(true), _height / getPixelDensity(true));
#endif

    setViewport((float)_width / getPixelDensity(true), (float)_height / getPixelDensity(true));
}